

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void lts2::PerformTVL1OnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float lambda,float patchMean)

{
  LBDOperator *LBD_00;
  _InputArray *p_Var1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Mat *pMVar5;
  Size patchSize_00;
  int iVar6;
  float patchMean_00;
  Rect ROI;
  Mat inputPatch;
  Mat resultPatch;
  Mat patchOnes;
  Mat ocount;
  Mat target;
  Mat freak;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  Mat *local_440;
  Mat *local_438;
  _OutputArray local_430;
  _InputArray local_418;
  LBDOperator *local_400;
  Size *local_3f8;
  _InputArray local_3f0 [4];
  int local_390;
  int local_38c;
  ulong local_388;
  ulong local_380;
  long *local_378;
  undefined8 uStack_370;
  long local_368 [12];
  Mat local_308 [96];
  Mat local_2a8 [152];
  Mat local_210 [96];
  Mat local_1b0 [96];
  _InputArray local_150 [4];
  double local_f0 [12];
  Mat local_90 [96];
  
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_380 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    patchSize_00 = (Size)result;
    cv::Mat::create(result,&local_380,5);
    local_150[0].obj = &local_378;
    local_368[0] = 0;
    local_368[1] = 0;
    local_378 = (long *)0x0;
    uStack_370 = 0;
    local_150[0].flags = -0x3efdfffa;
    local_150[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,local_150);
    local_388 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    local_368[0] = 0;
    local_368[1] = 0;
    local_378 = (long *)0x0;
    uStack_370 = 0;
    local_438 = anImage;
    cv::Mat::Mat((Mat *)local_150,&local_388,5,&local_378);
    local_390 = patchSize->width;
    local_38c = patchSize->height;
    cv::Mat::ones(&local_378,&local_390,5);
    local_440 = result;
    local_400 = LBD;
    local_3f8 = patchSize;
    cv::Mat::Mat(local_1b0);
    (**(code **)(*local_378 + 0x18))(local_378,&local_378,local_1b0,0xffffffff);
    cv::Mat::~Mat(local_2a8);
    cv::Mat::~Mat(local_308);
    cv::Mat::~Mat((Mat *)local_368);
    cv::Mat::Mat((Mat *)&local_378);
    cv::Mat::Mat(local_90);
    cv::Mat::Mat(local_210);
    LBD_00 = local_400;
    iVar4 = patchOffset->x;
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar3 = 1;
    if (1 < patchOffset->y) {
      iVar3 = patchOffset->y;
    }
    patchOffset->x = iVar4;
    patchOffset->y = iVar3;
    if (0 < *(int *)(local_438 + 8)) {
      iVar4 = 0;
      pMVar5 = local_438;
      do {
        iVar3 = *(int *)(pMVar5 + 0xc);
        if (0 < iVar3) {
          iVar6 = 0;
          do {
            local_448 = local_3f8->width;
            local_444 = local_3f8->height;
            local_450 = iVar6;
            local_44c = iVar4;
            if ((local_444 + iVar4 <= *(int *)(pMVar5 + 8)) && (local_448 + iVar6 <= iVar3)) {
              cv::Mat::Mat((Mat *)local_f0,pMVar5,(Rect_ *)&local_450);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x2010000;
              local_3f0[0].obj = &local_378;
              cv::Mat::copyTo((_OutputArray *)local_f0);
              cv::Mat::~Mat((Mat *)local_f0);
              patchMean_00 = patchMean;
              if (patchMean < 0.0) {
                local_3f0[0].sz.width = 0;
                local_3f0[0].sz.height = 0;
                local_3f0[0].flags = 0x1010000;
                local_3f0[0].obj = &local_378;
                cv::noArray();
                cv::mean((_InputArray *)local_f0,local_3f0);
                patchMean_00 = (float)local_f0[0];
              }
              (*(LBD_00->super_LinearOperator)._vptr_LinearOperator[2])(LBD_00,&local_378,local_90);
              RealReconstructionWithTVL1
                        (local_210,LBD_00,local_90,iterations,lambda,patchSize_00,patchMean_00);
              cv::Mat::Mat((Mat *)local_f0,local_440,(Rect_ *)&local_450);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_418.sz.width = 0;
              local_418.sz.height = 0;
              local_418.flags = 0x1010000;
              local_418.obj = local_210;
              local_430.super__InputArray.sz.width = 0;
              local_430.super__InputArray.sz.height = 0;
              local_430.super__InputArray.flags = -0x3dff0000;
              local_430.super__InputArray.obj = (_InputArray *)local_f0;
              local_3f0[0].obj = (_InputArray *)local_f0;
              p_Var1 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_418,&local_430,p_Var1,-1);
              cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_150,(Rect_ *)&local_450);
              cv::Mat::operator=((Mat *)local_f0,(Mat *)local_3f0);
              cv::Mat::~Mat((Mat *)local_3f0);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_418.sz.width = 0;
              local_418.sz.height = 0;
              local_418.flags = 0x1010000;
              local_418.obj = local_1b0;
              local_430.super__InputArray.sz.width = 0;
              local_430.super__InputArray.sz.height = 0;
              local_430.super__InputArray.flags = -0x3dff0000;
              local_430.super__InputArray.obj = (_InputArray *)local_f0;
              local_3f0[0].obj = (_InputArray *)local_f0;
              p_Var1 = (_InputArray *)cv::noArray();
              patchSize_00.width = -1;
              patchSize_00.height = 0;
              cv::add(local_3f0,&local_418,&local_430,p_Var1,-1);
              cv::Mat::~Mat((Mat *)local_f0);
              pMVar5 = local_438;
            }
            iVar6 = iVar6 + patchOffset->x;
            iVar3 = *(int *)(pMVar5 + 0xc);
          } while (iVar6 < iVar3);
        }
        iVar4 = iVar4 + patchOffset->y;
      } while (iVar4 < *(int *)(pMVar5 + 8));
    }
    finalize(local_440,(Mat *)local_150);
    cv::Mat::~Mat(local_210);
    cv::Mat::~Mat(local_90);
    cv::Mat::~Mat((Mat *)&local_378);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat((Mat *)local_150);
    return;
  }
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_378,"anImage.type() == CV_32F && anImage.channels() == 1","");
  uVar2 = cv::error(-0xd7,(string *)&local_378,"PerformTVL1OnImage",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x1cf);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void lts2::PerformTVL1OnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float lambda, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);
      lts2::RealReconstructionWithTVL1(resultPatch, LBD, freak, iterations,
                                      lambda, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}